

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::getAtomicOperationShaderFuncName
                 (AtomicOperation op)

{
  char *pcStack_10;
  AtomicOperation op_local;
  
  switch(op) {
  case ATOMIC_OPERATION_ADD:
    pcStack_10 = "imageAtomicAdd";
    break;
  case ATOMIC_OPERATION_MIN:
    pcStack_10 = "imageAtomicMin";
    break;
  case ATOMIC_OPERATION_MAX:
    pcStack_10 = "imageAtomicMax";
    break;
  case ATOMIC_OPERATION_AND:
    pcStack_10 = "imageAtomicAnd";
    break;
  case ATOMIC_OPERATION_OR:
    pcStack_10 = "imageAtomicOr";
    break;
  case ATOMIC_OPERATION_XOR:
    pcStack_10 = "imageAtomicXor";
    break;
  case ATOMIC_OPERATION_EXCHANGE:
    pcStack_10 = "imageAtomicExchange";
    break;
  case ATOMIC_OPERATION_COMP_SWAP:
    pcStack_10 = "imageAtomicCompSwap";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getAtomicOperationShaderFuncName (AtomicOperation op)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:			return "imageAtomicAdd";
		case ATOMIC_OPERATION_MIN:			return "imageAtomicMin";
		case ATOMIC_OPERATION_MAX:			return "imageAtomicMax";
		case ATOMIC_OPERATION_AND:			return "imageAtomicAnd";
		case ATOMIC_OPERATION_OR:			return "imageAtomicOr";
		case ATOMIC_OPERATION_XOR:			return "imageAtomicXor";
		case ATOMIC_OPERATION_EXCHANGE:		return "imageAtomicExchange";
		case ATOMIC_OPERATION_COMP_SWAP:	return "imageAtomicCompSwap";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}